

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.hpp
# Opt level: O0

void ws::log_helper<char_const(&)[25]>(Severity severity,FormatWithLoc *fmt,char (*args) [25])

{
  bool bVar1;
  Output OVar2;
  Logger *pLVar3;
  string local_c0;
  string local_90;
  __impl *local_70;
  time_point local_68;
  undefined1 local_60 [8];
  Record rec;
  char (*args_local) [25];
  FormatWithLoc *fmt_local;
  Severity severity_local;
  
  rec.message.field_2._8_8_ = args;
  pLVar3 = get_logger_instance();
  OVar2 = Logger::get_mode(pLVar3);
  if (OVar2 != none) {
    local_68.__d.__r = (duration)std::chrono::_V2::system_clock::now();
    local_70 = (__impl *)FormatWithLoc::get_loc(fmt);
    Record::Record((Record *)local_60,local_68,severity,(source_location)local_70);
    FormatWithLoc::get_fmt_abi_cxx11_(&local_90,fmt);
    bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                      (&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    if (bVar1) {
      Record::add<char_const(&)[25]>((Record *)local_60,(char (*) [25])rec.message.field_2._8_8_);
    }
    else {
      FormatWithLoc::get_fmt_abi_cxx11_(&local_c0,fmt);
      Record::add_fmt<char_const(&)[25]>
                ((Record *)local_60,&local_c0,(char (*) [25])rec.message.field_2._8_8_);
      std::__cxx11::string::~string((string *)&local_c0);
    }
    pLVar3 = get_logger_instance();
    Logger::add(pLVar3,(Record *)local_60);
    Record::~Record((Record *)local_60);
  }
  return;
}

Assistant:

void log_helper(Severity severity, const FormatWithLoc &fmt, Args &&...args)
  {
    if (get_logger_instance().get_mode() == Output::none)
    {
      return;
    }
    Record rec(std::chrono::system_clock::now(), severity, fmt.get_loc());
    if (fmt.get_fmt().empty())
    {
      rec.add(std::forward<Args>(args)...);
    }
    else
    {
      rec.add_fmt(fmt.get_fmt(), std::forward<Args>(args)...);
    }
    get_logger_instance().add(rec);
  }